

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::SetExceptionBreakpointsRequest>::copyConstruct
          (BasicTypeInfo<dap::SetExceptionBreakpointsRequest> *this,void *dst,void *src)

{
  void *src_local;
  void *dst_local;
  BasicTypeInfo<dap::SetExceptionBreakpointsRequest> *this_local;
  
  SetExceptionBreakpointsRequest::SetExceptionBreakpointsRequest
            ((SetExceptionBreakpointsRequest *)dst,(SetExceptionBreakpointsRequest *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }